

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::base64_valid(c4 *this,csubstr encoded)

{
  c4 cVar1;
  char *pcVar2;
  bool bVar3;
  
  if (((undefined1  [16])encoded & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
    for (pcVar2 = (char *)0x0; bVar3 = encoded.str == pcVar2, !bVar3; pcVar2 = pcVar2 + 1) {
      cVar1 = this[(long)pcVar2];
      if ((long)(char)cVar1 < 0) {
        return bVar3;
      }
      if ((cVar1 != (c4)0x3d) && ((&detail::base64_char_to_sextet_)[(char)cVar1] == -1)) {
        return bVar3;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool base64_valid(csubstr encoded)
{
    if(encoded.len % 4) return false;
    for(const char c : encoded)
    {
        if(c < 0/* || c >= 128*/)
            return false;
        if(c == '=')
            continue;
        if(detail::base64_char_to_sextet_[c] == char(-1))
            return false;
    }
    return true;
}